

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O1

AInventory * __thiscall ASigil::CreateCopy(ASigil *this,AActor *other)

{
  AInventory *pAVar1;
  DVector3 local_28;
  
  local_28.X = 0.0;
  local_28.Y = 0.0;
  local_28.Z = 0.0;
  pAVar1 = (AInventory *)
           AActor::StaticSpawn((PClassActor *)RegistrationInfo.MyClass,&local_28,NO_REPLACE,false);
  pAVar1->Amount = (this->super_AWeapon).super_AInventory.Amount;
  pAVar1->MaxAmount = (this->super_AWeapon).super_AInventory.MaxAmount;
  *(undefined4 *)((long)&pAVar1[1].super_AActor.Angles.CamRoll.Degrees + 4) =
       *(undefined4 *)&(this->super_AWeapon).field_0x584;
  (pAVar1->Icon).texnum = (this->super_AWeapon).super_AInventory.Icon.texnum;
  (*(this->super_AWeapon).super_AInventory.super_AActor.super_DThinker.super_DObject._vptr_DObject
    [0x36])(this);
  return pAVar1;
}

Assistant:

AInventory *ASigil::CreateCopy (AActor *other)
{
	ASigil *copy = Spawn<ASigil> ();
	copy->Amount = Amount;
	copy->MaxAmount = MaxAmount;
	copy->NumPieces = NumPieces;
	copy->Icon = Icon;
	GoAwayAndDie ();
	return copy;
}